

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O2

void __thiscall Assimp::LWO::Shader::Shader(Shader *this)

{
  allocator<char> local_12;
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"",&local_11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->functionName,"unknown",&local_12);
  this->enabled = true;
  return;
}

Assistant:

Shader()
        :   ordinal         ("\x00")
        ,   functionName    ("unknown")
        ,   enabled         (true)
    {}